

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text)

{
  bool bVar1;
  const_reference ppcVar2;
  cmake *this_00;
  string *text_local;
  MessageType t_local;
  cmMakefile *this_local;
  
  bVar1 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::empty
                    (&this->ExecutionStatusStack);
  if ((!bVar1) && ((t == FATAL_ERROR || (t == INTERNAL_ERROR)))) {
    ppcVar2 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::back
                        (&this->ExecutionStatusStack);
    cmExecutionStatus::SetNestedError(*ppcVar2);
  }
  this_00 = GetCMakeInstance(this);
  cmake::IssueMessage(this_00,t,text,&this->Backtrace);
  return;
}

Assistant:

void cmMakefile::IssueMessage(MessageType t, std::string const& text) const
{
  if (!this->ExecutionStatusStack.empty()) {
    if ((t == MessageType::FATAL_ERROR) ||
        (t == MessageType::INTERNAL_ERROR)) {
      this->ExecutionStatusStack.back()->SetNestedError();
    }
  }
  this->GetCMakeInstance()->IssueMessage(t, text, this->Backtrace);
}